

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_DigestFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pDigest,CK_ULONG_PTR pulDigestLen)

{
  int iVar1;
  Session *this_00;
  HashAlgorithm *pHVar2;
  size_t sVar3;
  uchar *__src;
  ulong __n;
  CK_RV CVar4;
  ByteString digest;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pulDigestLen == (CK_ULONG_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar1 = Session::getOpType(this_00);
  if (iVar1 != 4) {
    return 0x91;
  }
  pHVar2 = Session::getDigestOp(this_00);
  iVar1 = (*pHVar2->_vptr_HashAlgorithm[5])(pHVar2);
  __n = (ulong)iVar1;
  if (pDigest == (CK_BYTE_PTR)0x0) {
    *pulDigestLen = __n;
    return 0;
  }
  if (*pulDigestLen < __n) {
    *pulDigestLen = __n;
    return 0x150;
  }
  ByteString::ByteString(&digest);
  pHVar2 = Session::getDigestOp(this_00);
  iVar1 = (*pHVar2->_vptr_HashAlgorithm[4])(pHVar2,&digest);
  if ((char)iVar1 != '\0') {
    sVar3 = ByteString::size(&digest);
    if (sVar3 == __n) {
      __src = ByteString::byte_str(&digest);
      memcpy(pDigest,__src,__n);
      *pulDigestLen = __n;
      Session::resetOp(this_00);
      CVar4 = 0;
      goto LAB_00134b4c;
    }
    softHSMLog(3,"C_DigestFinal",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0xf38,"The size of the digest differ from the size of the mechanism");
  }
  Session::resetOp(this_00);
  CVar4 = 5;
LAB_00134b4c:
  ByteString::~ByteString(&digest);
  return CVar4;
}

Assistant:

CK_RV SoftHSM::C_DigestFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pDigest, CK_ULONG_PTR pulDigestLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pulDigestLen == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DIGEST) return CKR_OPERATION_NOT_INITIALIZED;

	// Return size
	CK_ULONG size = session->getDigestOp()->getHashSize();
	if (pDigest == NULL_PTR)
	{
		*pulDigestLen = size;
		return CKR_OK;
	}

	// Check buffer size
	if (*pulDigestLen < size)
	{
		*pulDigestLen = size;
		return CKR_BUFFER_TOO_SMALL;
	}

	// Get the digest
	ByteString digest;
	if (session->getDigestOp()->hashFinal(digest) == false)
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	// Check size
	if (digest.size() != size)
	{
		ERROR_MSG("The size of the digest differ from the size of the mechanism");
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}
	memcpy(pDigest, digest.byte_str(), size);
	*pulDigestLen = size;

	session->resetOp();

	return CKR_OK;
}